

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O3

void __thiscall YAML::Scanner::ScanNextToken(Scanner *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  RegEx *pRVar4;
  Exception *this_00;
  string local_50;
  Mark local_30;
  
  if (this->m_endedStream != false) {
    return;
  }
  if (this->m_startedStream == false) {
    StartStream(this);
    return;
  }
  ScanToNextToken(this);
  PopIndentToHere(this);
  bVar1 = YAML::Stream::operator_cast_to_bool(&this->INPUT);
  if (!bVar1) {
    EndStream(this);
    return;
  }
  if ((this->INPUT).m_mark.column == 0) {
    cVar2 = YAML::Stream::peek(&this->INPUT);
    if (cVar2 == '%') {
      ScanDirective(this);
      return;
    }
    if ((this->INPUT).m_mark.column == 0) {
      pRVar4 = Exp::DocStart();
      local_50._M_dataplus._M_p = (pointer)0x0;
      local_50._M_string_length = (size_type)this;
      iVar3 = RegEx::Match<YAML::StreamCharSource>(pRVar4,(StreamCharSource *)&local_50);
      if (-1 < iVar3) {
        ScanDocStart(this);
        return;
      }
      if ((this->INPUT).m_mark.column == 0) {
        pRVar4 = Exp::DocEnd();
        local_50._M_dataplus._M_p = (pointer)0x0;
        local_50._M_string_length = (size_type)this;
        iVar3 = RegEx::Match<YAML::StreamCharSource>(pRVar4,(StreamCharSource *)&local_50);
        if (-1 < iVar3) {
          ScanDocEnd(this);
          return;
        }
      }
    }
  }
  cVar2 = YAML::Stream::peek(&this->INPUT);
  if ((cVar2 == '[') || (cVar2 = YAML::Stream::peek(&this->INPUT), cVar2 == '{')) {
    ScanFlowStart(this);
    return;
  }
  cVar2 = YAML::Stream::peek(&this->INPUT);
  if ((cVar2 == ']') || (cVar2 = YAML::Stream::peek(&this->INPUT), cVar2 == '}')) {
    ScanFlowEnd(this);
    return;
  }
  cVar2 = YAML::Stream::peek(&this->INPUT);
  if (cVar2 == ',') {
    ScanFlowEntry(this);
    return;
  }
  pRVar4 = Exp::BlockEntry();
  local_50._M_dataplus._M_p = (pointer)0x0;
  local_50._M_string_length = (size_type)this;
  iVar3 = RegEx::Match<YAML::StreamCharSource>(pRVar4,(StreamCharSource *)&local_50);
  if (-1 < iVar3) {
    ScanBlockEntry(this);
    return;
  }
  if ((this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    pRVar4 = Exp::Key();
  }
  else {
    pRVar4 = Exp::KeyInFlow();
  }
  local_50._M_dataplus._M_p = (pointer)0x0;
  local_50._M_string_length = (size_type)this;
  iVar3 = RegEx::Match<YAML::StreamCharSource>(pRVar4,(StreamCharSource *)&local_50);
  if (-1 < iVar3) {
    ScanKey(this);
    return;
  }
  pRVar4 = GetValueRegex(this);
  local_50._M_dataplus._M_p = (pointer)0x0;
  local_50._M_string_length = (size_type)this;
  iVar3 = RegEx::Match<YAML::StreamCharSource>(pRVar4,(StreamCharSource *)&local_50);
  if (-1 < iVar3) {
    ScanValue(this);
    return;
  }
  cVar2 = YAML::Stream::peek(&this->INPUT);
  if ((cVar2 != '*') && (cVar2 = YAML::Stream::peek(&this->INPUT), cVar2 != '&')) {
    cVar2 = YAML::Stream::peek(&this->INPUT);
    if (cVar2 == '!') {
      ScanTag(this);
      return;
    }
    if (((this->m_flows).c.
         super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_cur ==
         (this->m_flows).c.
         super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
         _M_impl.super__Deque_impl_data._M_start._M_cur) &&
       ((cVar2 = YAML::Stream::peek(&this->INPUT), cVar2 == '|' ||
        (cVar2 = YAML::Stream::peek(&this->INPUT), cVar2 == '>')))) {
      ScanBlockScalar(this);
      return;
    }
    cVar2 = YAML::Stream::peek(&this->INPUT);
    if ((cVar2 == '\'') || (cVar2 = YAML::Stream::peek(&this->INPUT), cVar2 == '\"')) {
      ScanQuotedScalar(this);
      return;
    }
    if ((this->m_flows).c.
        super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->m_flows).c.
        super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur) {
      pRVar4 = Exp::PlainScalar();
    }
    else {
      pRVar4 = Exp::PlainScalarInFlow();
    }
    local_50._M_dataplus._M_p = (pointer)0x0;
    local_50._M_string_length = (size_type)this;
    iVar3 = RegEx::Match<YAML::StreamCharSource>(pRVar4,(StreamCharSource *)&local_50);
    if (-1 < iVar3) {
      ScanPlainScalar(this);
      return;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x40);
    local_30.pos = (this->INPUT).m_mark.pos;
    local_30.line = (this->INPUT).m_mark.line;
    local_30.column = (this->INPUT).m_mark.column;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"unknown token","");
    Exception::Exception(this_00,&local_30,&local_50);
    *(undefined ***)this_00 = &PTR__BadFile_008779d0;
    __cxa_throw(this_00,&ParserException::typeinfo,BadFile::~BadFile);
  }
  ScanAnchorOrAlias(this);
  return;
}

Assistant:

void Scanner::ScanNextToken() {
  if (m_endedStream) {
    return;
  }

  if (!m_startedStream) {
    return StartStream();
  }

  // get rid of whitespace, etc. (in between tokens it should be irrelevant)
  ScanToNextToken();

  // maybe need to end some blocks
  PopIndentToHere();

  // *****
  // And now branch based on the next few characters!
  // *****

  // end of stream
  if (!INPUT) {
    return EndStream();
  }

  if (INPUT.column() == 0 && INPUT.peek() == Keys::Directive) {
    return ScanDirective();
  }

  // document token
  if (INPUT.column() == 0 && Exp::DocStart().Matches(INPUT)) {
    return ScanDocStart();
  }

  if (INPUT.column() == 0 && Exp::DocEnd().Matches(INPUT)) {
    return ScanDocEnd();
  }

  // flow start/end/entry
  if (INPUT.peek() == Keys::FlowSeqStart ||
      INPUT.peek() == Keys::FlowMapStart) {
    return ScanFlowStart();
  }

  if (INPUT.peek() == Keys::FlowSeqEnd || INPUT.peek() == Keys::FlowMapEnd) {
    return ScanFlowEnd();
  }

  if (INPUT.peek() == Keys::FlowEntry) {
    return ScanFlowEntry();
  }

  // block/map stuff
  if (Exp::BlockEntry().Matches(INPUT)) {
    return ScanBlockEntry();
  }

  if ((InBlockContext() ? Exp::Key() : Exp::KeyInFlow()).Matches(INPUT)) {
    return ScanKey();
  }

  if (GetValueRegex().Matches(INPUT)) {
    return ScanValue();
  }

  // alias/anchor
  if (INPUT.peek() == Keys::Alias || INPUT.peek() == Keys::Anchor) {
    return ScanAnchorOrAlias();
  }

  // tag
  if (INPUT.peek() == Keys::Tag) {
    return ScanTag();
  }

  // special scalars
  if (InBlockContext() && (INPUT.peek() == Keys::LiteralScalar ||
                           INPUT.peek() == Keys::FoldedScalar)) {
    return ScanBlockScalar();
  }

  if (INPUT.peek() == '\'' || INPUT.peek() == '\"') {
    return ScanQuotedScalar();
  }

  // plain scalars
  if ((InBlockContext() ? Exp::PlainScalar() : Exp::PlainScalarInFlow())
          .Matches(INPUT)) {
    return ScanPlainScalar();
  }

  // don't know what it is!
  throw ParserException(INPUT.mark(), ErrorMsg::UNKNOWN_TOKEN);
}